

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool dg::pta::PointerAnalysisFSInv::invalidateMemory(PSNode *node)

{
  bool bVar1;
  reference ppPVar2;
  long in_RDI;
  PSNode *pred;
  const_iterator __end2;
  const_iterator __begin2;
  NodesVec *__range2;
  bool changed;
  bool in_stack_0000018f;
  PSNode *in_stack_00000190;
  PSNode *in_stack_00000198;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffc8;
  PSNode *in_stack_ffffffffffffffd0;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_20;
  NodesVec *local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = SubgraphNode<dg::pta::PSNode>::predecessors
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
  local_20._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end(in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppPVar2;
    bVar1 = invalidateMemory(in_stack_00000198,in_stack_00000190,in_stack_0000018f);
    local_9 = (local_9 & 1) != 0 || bVar1;
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_20);
  }
  return (bool)(local_9 & 1);
}

Assistant:

static bool invalidateMemory(PSNode *node) {
        bool changed = false;
        for (PSNode *pred : node->predecessors()) {
            changed |= invalidateMemory(node, pred);
        }
        return changed;
    }